

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O2

int archive_read_open1(archive *_a)

{
  long lVar1;
  size_t sVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  archive_string_conv **ppaVar8;
  uint uVar9;
  size_t sVar10;
  char *pcVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  long local_38;
  
  iVar4 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_open");
  if (iVar4 == -0x1e) {
    return -0x1e;
  }
  archive_clear_error(_a);
  if (_a[1].error == (char *)0x0) {
    archive_set_error(_a,0x16,"No reader function provided to archive_read_open");
  }
  else {
    if ((*(code **)&_a[1].file_count != (code *)0x0) &&
       (iVar4 = (**(code **)&_a[1].file_count)(_a,*(undefined8 *)(_a[1].read_data_block + 0x10)),
       iVar4 != 0)) {
      read_client_close_proxy((archive_read *)_a);
      return iVar4;
    }
    pvVar7 = calloc(1,0x90);
    if (pvVar7 == (void *)0x0) {
      return -0x1e;
    }
    *(archive **)((long)pvVar7 + 0x18) = _a;
    pcVar11 = _a[1].read_data_block;
    *(undefined8 *)((long)pvVar7 + 0x28) = *(undefined8 *)(pcVar11 + 0x10);
    *(archive_read_filter_vtable **)((long)pvVar7 + 0x20) = &none_reader_vtable;
    *(char **)((long)pvVar7 + 0x30) = "none";
    *(undefined8 *)((long)pvVar7 + 0x3c) = 0x100000001;
    pcVar11[0] = '\0';
    pcVar11[1] = '\0';
    pcVar11[2] = '\0';
    pcVar11[3] = '\0';
    pcVar11[4] = '\0';
    pcVar11[5] = '\0';
    pcVar11[6] = '\0';
    pcVar11[7] = '\0';
    sVar2 = _a[4].error_string.length;
    if ((sVar2 == 0) || ((int)_a[4].error_string.buffer_length == 0)) {
      _a[4].error_string.length = (size_t)pvVar7;
      iVar4 = 0;
      while( true ) {
        if (iVar4 == 0x19) {
          archive_set_error(_a,0x54,"Input requires too many filters for decoding");
          goto LAB_00501039;
        }
        iVar6 = 0;
        lVar16 = 0;
        for (lVar12 = 0; (int)lVar12 != 0x180; lVar12 = lVar12 + 0x18) {
          puVar3 = *(undefined8 **)((long)&_a[1].read_data_remaining + lVar12);
          if (puVar3 != (undefined8 *)0x0) {
            lVar1 = (long)&_a[1].read_data_offset + lVar12;
            iVar5 = (*(code *)*puVar3)(lVar1,_a[4].error_string.length);
            if (iVar6 < iVar5) {
              lVar16 = lVar1;
              iVar6 = iVar5;
            }
          }
        }
        if (lVar16 == 0) break;
        pvVar7 = calloc(1,0x90);
        if (pvVar7 == (void *)0x0) goto LAB_00501039;
        *(long *)((long)pvVar7 + 8) = lVar16;
        *(archive **)((long)pvVar7 + 0x18) = _a;
        *(size_t *)((long)pvVar7 + 0x10) = _a[4].error_string.length;
        _a[4].error_string.length = (size_t)pvVar7;
        iVar6 = (**(code **)(*(long *)(lVar16 + 0x10) + 8))(pvVar7);
        iVar4 = iVar4 + 1;
        if (iVar6 != 0) {
LAB_00501031:
          __archive_read_free_filters((archive_read *)_a);
LAB_00501039:
          _a->state = 0x8000;
          return -0x1e;
        }
      }
      __archive_read_filter_ahead((archive_read_filter *)_a[4].error_string.length,1,&local_38);
      if (-1 < local_38) goto LAB_00500e72;
      goto LAB_00501031;
    }
    do {
      sVar10 = sVar2;
      sVar2 = *(size_t *)(sVar10 + 0x10);
    } while (sVar2 != 0);
    *(void **)(sVar10 + 0x10) = pvVar7;
LAB_00500e72:
    if (_a[0xe].error_string.length != 0) {
LAB_00500e80:
      _a->state = 2;
      client_switch_proxy((archive_read_filter *)_a[4].error_string.length,0);
      return 0;
    }
    iVar4 = -1;
    uVar15 = 0;
    uVar14 = 0xffffffff;
    ppaVar8 = &_a[4].sconv;
    while( true ) {
      _a[0xe].error_string.length = (size_t)ppaVar8;
      uVar13 = (uint)uVar14;
      if (uVar15 == 0x10) break;
      if (ppaVar8[2] != (archive_string_conv *)0x0) {
        iVar6 = (*(code *)ppaVar8[2])(_a);
        if (iVar6 == -0x1e) goto LAB_00501096;
        if (*(long *)_a[4].error_string.length != 0) {
          __archive_read_seek((archive_read *)_a,0,0);
        }
        uVar9 = uVar15;
        if (-1 < (int)uVar13 && iVar6 <= iVar4) {
          uVar9 = uVar13;
          iVar6 = iVar4;
        }
        ppaVar8 = (archive_string_conv **)_a[0xe].error_string.length;
        uVar14 = (ulong)uVar9;
        iVar4 = iVar6;
      }
      uVar15 = uVar15 + 1;
      ppaVar8 = ppaVar8 + 0xb;
    }
    if ((int)uVar13 < 0) {
      pcVar11 = "No formats registered";
    }
    else {
      if (0 < iVar4) {
        _a[0xe].error_string.length = (size_t)(&_a[4].sconv + uVar14 * 0xb);
        goto LAB_00500e80;
      }
      pcVar11 = "Unrecognized archive format";
    }
    archive_set_error(_a,0x54,pcVar11);
LAB_00501096:
    close_filters((archive_read *)_a);
  }
  _a->state = 0x8000;
  return -0x1e;
}

Assistant:

int
archive_read_open1(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *filter, *tmp;
	int slot, e = ARCHIVE_OK;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_open");
	archive_clear_error(&a->archive);

	if (a->client.reader == NULL) {
		archive_set_error(&a->archive, EINVAL,
		    "No reader function provided to archive_read_open");
		a->archive.state = ARCHIVE_STATE_FATAL;
		return (ARCHIVE_FATAL);
	}

	/* Open data source. */
	if (a->client.opener != NULL) {
		e = (a->client.opener)(&a->archive, a->client.dataset[0].data);
		if (e != 0) {
			/* If the open failed, call the closer to clean up. */
			read_client_close_proxy(a);
			return (e);
		}
	}

	filter = calloc(1, sizeof(*filter));
	if (filter == NULL)
		return (ARCHIVE_FATAL);
	filter->bidder = NULL;
	filter->upstream = NULL;
	filter->archive = a;
	filter->data = a->client.dataset[0].data;
	filter->vtable = &none_reader_vtable;
	filter->name = "none";
	filter->code = ARCHIVE_FILTER_NONE;
	filter->can_skip = 1;
	filter->can_seek = 1;

	a->client.dataset[0].begin_position = 0;
	if (!a->filter || !a->bypass_filter_bidding)
	{
		a->filter = filter;
		/* Build out the input pipeline. */
		e = choose_filters(a);
		if (e < ARCHIVE_WARN) {
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
	}
	else
	{
		/* Need to add "NONE" type filter at the end of the filter chain */
		tmp = a->filter;
		while (tmp->upstream)
			tmp = tmp->upstream;
		tmp->upstream = filter;
	}

	if (!a->format)
	{
		slot = choose_format(a);
		if (slot < 0) {
			close_filters(a);
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
		a->format = &(a->formats[slot]);
	}

	a->archive.state = ARCHIVE_STATE_HEADER;

	/* Ensure libarchive starts from the first node in a multivolume set */
	client_switch_proxy(a->filter, 0);
	return (e);
}